

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O3

void __thiscall HighsLpRelaxation::setObjectiveLimit(HighsLpRelaxation *this,double objlim)

{
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var1;
  double dVar2;
  double local_58;
  string local_38;
  
  _Var1._M_head_impl =
       (this->mipsolver->mipdata_)._M_t.
       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
       super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  dVar2 = *(double *)((long)&(_Var1._M_head_impl)->objectiveFunction + 8);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    local_58 = 0.5 / dVar2;
  }
  else {
    dVar2 = (_Var1._M_head_impl)->feastol * 1000.0;
    local_58 = ABS(objlim) * 1e-14;
    if (ABS(objlim) * 1e-14 <= dVar2) {
      local_58 = dVar2;
    }
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"objective_bound","");
  Highs::setOptionValue(&this->lpsolver,&local_38,local_58 + objlim);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void HighsLpRelaxation::setObjectiveLimit(double objlim) {
  double offset;
  if (mipsolver.mipdata_->objectiveFunction.isIntegral())
    offset = 0.5 / mipsolver.mipdata_->objectiveFunction.integralScale();
  else
    offset = std::max(1000.0 * mipsolver.mipdata_->feastol,
                      std::abs(objlim) * kHighsTiny);

  lpsolver.setOptionValue("objective_bound", objlim + offset);
}